

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

BasicBlock * __thiscall
wasm::
CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::
startBasicBlock(CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                *this)

{
  BasicBlock *pBVar1;
  unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
  local_18;
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *local_10;
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *this_local;
  
  local_10 = this;
  pBVar1 = makeBasicBlock(this);
  this->currBasicBlock = pBVar1;
  std::
  unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::AsyncifyLocals::findRelevantLiveLocals(wasm::Function*)::RelevantLiveLocalsWalker,wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals::findRelevantLiveLocals(wasm::Function*)::RelevantLiveLocalsWalker,void>,wasm::Liveness>::BasicBlock,std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::AsyncifyLocals::findRelevantLiveLocals(wasm::Function*)::RelevantLiveLocalsWalker,wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals::findRelevantLiveLocals(wasm::Function*)::RelevantLiveLocalsWalker,void>,wasm::Liveness>::BasicBlock>>
  ::
  unique_ptr<std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::AsyncifyLocals::findRelevantLiveLocals(wasm::Function*)::RelevantLiveLocalsWalker,wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals::findRelevantLiveLocals(wasm::Function*)::RelevantLiveLocalsWalker,void>,wasm::Liveness>::BasicBlock>,void>
            ((unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::AsyncifyLocals::findRelevantLiveLocals(wasm::Function*)::RelevantLiveLocalsWalker,wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals::findRelevantLiveLocals(wasm::Function*)::RelevantLiveLocalsWalker,void>,wasm::Liveness>::BasicBlock,std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::AsyncifyLocals::findRelevantLiveLocals(wasm::Function*)::RelevantLiveLocalsWalker,wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals::findRelevantLiveLocals(wasm::Function*)::RelevantLiveLocalsWalker,void>,wasm::Liveness>::BasicBlock>>
              *)&local_18,this->currBasicBlock);
  std::
  vector<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ::push_back(&this->basicBlocks,(value_type *)&local_18);
  std::
  unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
  ::~unique_ptr(&local_18);
  return this->currBasicBlock;
}

Assistant:

BasicBlock* startBasicBlock() {
    currBasicBlock = ((SubType*)this)->makeBasicBlock();
    basicBlocks.push_back(std::unique_ptr<BasicBlock>(currBasicBlock));
    return currBasicBlock;
  }